

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ppu_registers.h
# Opt level: O2

void __thiscall n_e_s::core::PpuVram::increase_coarse_x(PpuVram *this)

{
  ushort uVar1;
  byte bVar2;
  
  uVar1 = (this->super_Register<unsigned_short>).value_;
  bVar2 = (byte)uVar1 & 0x1f;
  if (bVar2 == 0x1f) {
    uVar1 = uVar1 & 0xffe0 ^ 0x400;
  }
  else {
    uVar1 = (ushort)(byte)(bVar2 + 1) | uVar1 & 0xffe0;
  }
  (this->super_Register<unsigned_short>).value_ = uVar1;
  return;
}

Assistant:

[[nodiscard]] constexpr uint8_t coarse_scroll_x() const {
        return value_ & 0b0001'1111u;
    }